

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O3

void __thiscall Player::Player(Player *this,int min,int max)

{
  FateDeck *this_00;
  GreenCard *card;
  BlackCard *pBVar1;
  int iVar2;
  Stronghold *pSVar3;
  DeckBuilder *pDVar4;
  _List_node_base *green;
  _List_node_base *black;
  list<BlackCard_*,_std::allocator<BlackCard_*>_> *plVar5;
  long lVar6;
  int iVar7;
  _List_node_base *p_Var8;
  long *plVar9;
  _List_node_base *p_Var10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_151;
  DeckBuilder *local_150;
  DynastyDeck *local_148;
  DynastyDeck *local_140;
  Deck *local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  long *local_50 [2];
  long local_40 [2];
  
  this->stronghold = (Stronghold *)0x0;
  this_00 = &this->fateDeck;
  FateDeck::FateDeck(this_00);
  local_148 = &this->dynDeck;
  DynastyDeck::DynastyDeck(local_148);
  local_140 = &this->provinces;
  DynastyDeck::DynastyDeck(local_140);
  local_138 = &this->hand;
  Deck::Deck(local_138);
  DynastyDeck::DynastyDeck(&this->holdings);
  DynastyDeck::DynastyDeck(&this->army);
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Golden Plains Outpost","");
  local_110[0] = local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"High House of Light","");
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"Closed Shell Castle","");
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"Mountain\'s Anvil Castle","");
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"Seven Strings Keep","");
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"City of the Open Hand","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"Shiro City","");
  plVar9 = local_40;
  local_50[0] = plVar9;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Red Fort","");
  __l._M_len = 8;
  __l._M_array = &local_130;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->names,__l,&local_151);
  lVar6 = -0x100;
  do {
    if (plVar9 != (long *)plVar9[-2]) {
      operator_delete((long *)plVar9[-2],*plVar9 + 1);
    }
    plVar9 = plVar9 + -4;
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0);
  pSVar3 = GenerateRandomStronghold(this);
  this->stronghold = pSVar3;
  iVar2 = (*(pSVar3->super_BlackCard).super_Card._vptr_Card[6])(pSVar3);
  this->honour = iVar2;
  this->minCards = min;
  this->maxCards = max;
  this->numberOfProvinces = 4;
  this->maxHand = 6;
  pDVar4 = (DeckBuilder *)operator_new(0x10);
  DeckBuilder::DeckBuilder(pDVar4);
  green = (_List_node_base *)DeckBuilder::createFateDeck_abi_cxx11_(pDVar4);
  DeckBuilder::deckShuffler(pDVar4,(list<GreenCard_*,_std::allocator<GreenCard_*>_> *)green);
  black = (_List_node_base *)DeckBuilder::createDynastyDeck_abi_cxx11_(pDVar4);
  local_150 = pDVar4;
  DeckBuilder::deckShuffler(pDVar4,(list<BlackCard_*,_std::allocator<BlackCard_*>_> *)black);
  p_Var8 = (((_List_base<GreenCard_*,_std::allocator<GreenCard_*>_> *)&green->_M_next)->_M_impl).
           _M_node.super__List_node_base._M_next;
  iVar2 = this->maxCards;
  iVar7 = 0;
  if (iVar2 != 0 && p_Var8 != green) {
    do {
      FateDeck::pushCard(this_00,(GreenCard *)p_Var8[1]._M_next);
      std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::remove
                ((list<GreenCard_*,_std::allocator<GreenCard_*>_> *)green,(char *)(p_Var8 + 1));
      iVar7 = iVar7 + 1;
      p_Var8 = green->_M_next->_M_next;
      iVar2 = this->maxCards;
      if (p_Var8 == green) break;
    } while (iVar7 != iVar2);
  }
  if (iVar7 < this->minCards) {
    green = (_List_node_base *)DeckBuilder::createFateDeck_abi_cxx11_(local_150);
    DeckBuilder::deckShuffler(local_150,(list<GreenCard_*,_std::allocator<GreenCard_*>_> *)green);
    p_Var8 = green->_M_next;
    iVar2 = this->maxCards;
    if (iVar7 != iVar2 && p_Var8 != green) {
      do {
        card = (GreenCard *)p_Var8[1]._M_next;
        FateDeck::pushCard(this_00,card);
        std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::remove
                  ((list<GreenCard_*,_std::allocator<GreenCard_*>_> *)green,(char *)(p_Var8 + 1));
        if (card != (GreenCard *)0x0) {
          (*(card->super_Card)._vptr_Card[3])(card);
        }
        iVar7 = iVar7 + 1;
        p_Var8 = green->_M_next->_M_next;
        iVar2 = this->maxCards;
      } while ((p_Var8 != green) && (iVar7 != iVar2));
    }
  }
  p_Var10 = (((_List_base<BlackCard_*,_std::allocator<BlackCard_*>_> *)&black->_M_next)->_M_impl).
            _M_node.super__List_node_base._M_next;
  if ((p_Var10 != black) && (iVar7 != iVar2)) {
    do {
      pBVar1 = (BlackCard *)p_Var10[1]._M_next;
      DynastyDeck::pushCard(local_148,pBVar1);
      std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::remove
                ((list<BlackCard_*,_std::allocator<BlackCard_*>_> *)black,(char *)(p_Var10 + 1));
      if (pBVar1 != (BlackCard *)0x0) {
        (*(pBVar1->super_Card)._vptr_Card[3])(pBVar1);
      }
      iVar7 = iVar7 + 1;
      p_Var10 = black->_M_next->_M_next;
    } while ((p_Var10 != black) && (iVar7 != this->maxCards));
  }
  pDVar4 = local_150;
  if (iVar7 < this->minCards) {
    black = (_List_node_base *)DeckBuilder::createDynastyDeck_abi_cxx11_(local_150);
    DeckBuilder::deckShuffler(local_150,(list<BlackCard_*,_std::allocator<BlackCard_*>_> *)black);
    p_Var10 = black->_M_next;
    pDVar4 = local_150;
    if ((p_Var10 != black) && (iVar7 != this->maxCards)) {
      do {
        iVar7 = iVar7 + 1;
        pBVar1 = (BlackCard *)p_Var10[1]._M_next;
        DynastyDeck::pushCard(local_148,pBVar1);
        std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::remove
                  ((list<BlackCard_*,_std::allocator<BlackCard_*>_> *)black,(char *)(p_Var10 + 1));
        if (pBVar1 != (BlackCard *)0x0) {
          (*(pBVar1->super_Card)._vptr_Card[3])(pBVar1);
        }
        p_Var10 = black->_M_next->_M_next;
        pDVar4 = local_150;
      } while ((p_Var10 != black) && (iVar7 != this->maxCards));
    }
  }
  while (plVar5 = DynastyDeck::getDynDeck_abi_cxx11_(local_140),
        (plVar5->super__List_base<BlackCard_*,_std::allocator<BlackCard_*>_>)._M_impl._M_node.
        _M_size < 5) {
    DeckBuilder::deckShuffler(pDVar4,(list<BlackCard_*,_std::allocator<BlackCard_*>_> *)black);
    if (black->_M_next == black) {
      black = (_List_node_base *)DeckBuilder::createDynastyDeck_abi_cxx11_(pDVar4);
      DeckBuilder::deckShuffler(pDVar4,(list<BlackCard_*,_std::allocator<BlackCard_*>_> *)black);
      p_Var10 = black->_M_next;
    }
    DynastyDeck::pushCard(local_140,(BlackCard *)p_Var10[1]._M_next);
    std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::remove
              ((list<BlackCard_*,_std::allocator<BlackCard_*>_> *)black,(char *)(p_Var10 + 1));
    p_Var10 = black->_M_next;
  }
  iVar2 = 3;
  do {
    DeckBuilder::deckShuffler(pDVar4,(list<GreenCard_*,_std::allocator<GreenCard_*>_> *)green);
    if (green->_M_next == green) {
      green = (_List_node_base *)DeckBuilder::createFateDeck_abi_cxx11_(pDVar4);
      DeckBuilder::deckShuffler(pDVar4,(list<GreenCard_*,_std::allocator<GreenCard_*>_> *)green);
      p_Var8 = green->_M_next;
    }
    Deck::pushCard(local_138,(Card *)p_Var8[1]._M_next);
    std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::remove
              ((list<GreenCard_*,_std::allocator<GreenCard_*>_> *)green,(char *)(p_Var8 + 1));
    p_Var8 = green->_M_next;
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  DeckBuilder::~DeckBuilder(pDVar4);
  operator_delete(pDVar4,0x10);
  return;
}

Assistant:

Player::Player(int min, int max)
{
    stronghold = GenerateRandomStronghold();
    honour = stronghold->getHonour();

    minCards = min;
    maxCards = max;
    numberOfProvinces = 4;
    maxHand = 6;

    int count = 0;

    //creates general decks with all the cards and shuffles them
    DeckBuilder *build = new DeckBuilder();

    list<GreenCard*> *green = build->createFateDeck();
    list<GreenCard*>::iterator it = green->begin();
    build->deckShuffler(green);

    list<BlackCard*> *black = build->createDynastyDeck();
    list<BlackCard*>::iterator it1 = black->begin();
    build->deckShuffler(black);

    //creates fateDeck with num E[minCards, maxCards] cards from green
    for (it=green->begin(); it!=green->end(); it++)
    {
        if (count == maxCards)
            break;

        GreenCard *newCard = *it;
        fateDeck.pushCard(newCard);

        green->remove(*it);
        count++;

        newCard = nullptr;
        delete newCard;
        it=green->begin();
    }
    if (count < minCards)           //if deck too small creates a new green deck and adds more
    {
        green = build->createFateDeck();
        build->deckShuffler(green);

        for (it=green->begin(); it!=green->end(); it++)
        {
            if (count == maxCards)
                break;

            GreenCard *newCard = *it;
            fateDeck.pushCard(newCard);

            green->remove(*it);
            count++;

            delete newCard;
            it=green->begin();
        }
    }

    //creates dynDeck with num E[minCards, maxCards] cards from black
    for (it1=black->begin(); it1!=black->end(); it1++)
    {
        if (count == maxCards)
            break;

        BlackCard *newCard = *it1;
        dynDeck.pushCard(newCard);

        black->remove(*it1);
        count++;

        delete newCard;
        it1=black->begin();
    }

    if (count < minCards)           //if deck too small creates a new green deck and adds more
    {
        black = build->createDynastyDeck();
        build->deckShuffler(black);

        for (it1=black->begin(); it1!=black->end(); it1++)
        {
            if (count == maxCards)
                break;

            BlackCard *newCard = *it1;
            dynDeck.pushCard(newCard);

            black->remove(*it1);
            count++;

            delete newCard;
            it1=black->begin();
        }
    }

    //creates provinces with first 4 cards of black
    while (provinces.getDynDeck().size() < 5)//4 cards + list.end()
    {
        build->deckShuffler(black);
        if (black->empty())                                 //if it empties generate a new black deck and shuffle it
        {
            black = build->createDynastyDeck();
            build->deckShuffler(black);
            it1 = black->begin();
        }

        BlackCard *newCard = *it1;
        provinces.pushCard(newCard);

        black->remove(*it1);
        it1=black->begin();
    }

    //builds hand with first 3 cards of green deck
    int i;
    for (i=0; i<3; i++)                                     //players start with 3 cards in their hand
    {
        build->deckShuffler(green);
        if (green->empty())                                 //if it empties generate a new green deck and shuffle it
        {
            green = build->createFateDeck();
            build->deckShuffler(green);
            it = green->begin();
        }
        GreenCard *newCard = *it;
        hand.pushCard(newCard);

        green->remove(*it);
        it = green->begin();
    }

    delete build;
}